

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Rhs>::GenMatcher::
init<Kernel::Literal*>(GenMatcher *this,Literal *query,uint nextSpecVar)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint *puVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  int iVar11;
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  int iVar14;
  undefined1 auVar13 [16];
  
  (this->_boundVars)._cursor = (this->_boundVars)._stack;
  puVar5 = &(this->_bindings)._timestamp;
  *puVar5 = *puVar5 + 1;
  auVar3 = _DAT_0084f040;
  auVar2 = _DAT_0084f030;
  auVar1 = _DAT_0084f020;
  if (*puVar5 == 0) {
    sVar9 = (this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._capacity;
    if (sVar9 != 0) {
      uVar6 = sVar9 + 0xfffffffffffffff;
      uVar7 = uVar6 & 0xfffffffffffffff;
      auVar10._8_4_ = (int)uVar7;
      auVar10._0_8_ = uVar7;
      auVar10._12_4_ = (int)(uVar7 >> 0x20);
      puVar5 = &(this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>._array[3].
                _timestamp;
      lVar8 = 0;
      auVar10 = auVar10 ^ _DAT_0084f040;
      do {
        auVar12._8_4_ = (int)lVar8;
        auVar12._0_8_ = lVar8;
        auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar13 = (auVar12 | auVar2) ^ auVar3;
        iVar11 = auVar10._4_4_;
        if ((bool)(~(auVar13._4_4_ == iVar11 && auVar10._0_4_ < auVar13._0_4_ ||
                    iVar11 < auVar13._4_4_) & 1)) {
          puVar5[-0xc] = 0;
        }
        if ((auVar13._12_4_ != auVar10._12_4_ || auVar13._8_4_ <= auVar10._8_4_) &&
            auVar13._12_4_ <= auVar10._12_4_) {
          puVar5[-8] = 0;
        }
        auVar12 = (auVar12 | auVar1) ^ auVar3;
        iVar14 = auVar12._4_4_;
        if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar12._0_4_ <= auVar10._0_4_)) {
          puVar5[-4] = 0;
          *puVar5 = 0;
        }
        lVar8 = lVar8 + 4;
        puVar5 = puVar5 + 0x10;
      } while ((uVar7 - ((uint)uVar6 & 3)) + 4 != lVar8);
    }
    (this->_bindings)._timestamp = 1;
  }
  uVar4 = (query->super_Term)._weight;
  this->_maxVar = uVar4 - 1;
  uVar6 = (this->_specVars)._size;
  if (uVar6 < nextSpecVar) {
    uVar4 = (int)uVar6 * 2;
    sVar9 = (size_t)uVar4;
    if (uVar4 <= nextSpecVar) {
      sVar9 = (size_t)nextSpecVar;
    }
    Lib::DArray<Kernel::TermList>::ensure(&this->_specVars,sVar9);
    uVar4 = (query->super_Term)._weight;
  }
  Lib::DArray<Lib::ArrayMapEntry<Kernel::TermList>_>::ensure
            (&(this->_bindings).super_DArray<Lib::ArrayMapEntry<Kernel::TermList>_>,(ulong)uVar4);
  return;
}

Assistant:

void init(TermOrLit query, unsigned nextSpecVar)
      {
        _boundVars.reset();
        // _specVars->reset(); <- does not need to be reset as we only write before we read 
        _bindings.reset();

        _maxVar = weight(query) - 1;
        if(_specVars.size()<nextSpecVar) {
          //_specVars can get really big, but it was introduced instead of hash table
          //during optimizations, as it raised performance by abour 5%.
          _specVars.ensure(std::max(static_cast<unsigned>(_specVars.size()*2), nextSpecVar));
        }
        _bindings.ensure(weight(query));
      }